

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

VP8LHistogram * VP8LAllocateHistogram(int cache_bits)

{
  int iVar1;
  uint8_t *memory;
  int total_size;
  VP8LHistogram *histo;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  uint64_t nmemb;
  VP8LHistogram *local_8;
  
  nmemb = 0;
  iVar1 = GetHistogramSize(in_stack_ffffffffffffffe4);
  local_8 = (VP8LHistogram *)WebPSafeMalloc(nmemb,CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  if (local_8 == (VP8LHistogram *)0x0) {
    local_8 = (VP8LHistogram *)0x0;
  }
  else {
    local_8->literal = (uint32_t *)(local_8 + 1);
    VP8LHistogramInit((VP8LHistogram *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                      (int)((ulong)local_8 >> 0x20),(int)local_8);
  }
  return local_8;
}

Assistant:

VP8LHistogram* VP8LAllocateHistogram(int cache_bits) {
  VP8LHistogram* histo = NULL;
  const int total_size = GetHistogramSize(cache_bits);
  uint8_t* const memory = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*memory));
  if (memory == NULL) return NULL;
  histo = (VP8LHistogram*)memory;
  // 'literal' won't necessary be aligned.
  histo->literal = (uint32_t*)(memory + sizeof(VP8LHistogram));
  VP8LHistogramInit(histo, cache_bits, /*init_arrays=*/ 0);
  return histo;
}